

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall DDecalFader::Tick(DDecalFader *this)

{
  int iVar1;
  DBaseDecal *pDVar2;
  int iVar3;
  
  pDVar2 = (this->super_DDecalThinker).TheDecal.field_0.p;
  if (pDVar2 != (DBaseDecal *)0x0) {
    if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((this->TimeToStartDecay <= level.maptime) && ((bglobal._16_1_ & 1) == 0)) {
        iVar1 = this->TimeToEndDecay;
        iVar3 = iVar1 - level.maptime;
        if (iVar3 == 0 || iVar1 < level.maptime) {
          (*(((this->super_DDecalThinker).TheDecal.field_0.p)->super_DThinker).super_DObject.
            _vptr_DObject[4])();
          goto LAB_00374dee;
        }
        if ((this->StartTrans == -1.0) && (!NAN(this->StartTrans))) {
          this->StartTrans = ((this->super_DDecalThinker).TheDecal.field_0.p)->Alpha;
        }
        ((this->super_DDecalThinker).TheDecal.field_0.p)->Alpha =
             ((double)iVar3 * this->StartTrans) / (double)(iVar1 - this->TimeToStartDecay);
      }
      return;
    }
    (this->super_DDecalThinker).TheDecal.field_0.p = (DBaseDecal *)0x0;
  }
LAB_00374dee:
  (*(this->super_DDecalThinker).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DDecalFader::Tick ()
{
	if (TheDecal == NULL)
	{
		Destroy ();
	}
	else
	{
		if (level.maptime < TimeToStartDecay || bglobal.freeze)
		{
			return;
		}
		else if (level.maptime >= TimeToEndDecay)
		{
			TheDecal->Destroy ();		// remove the decal
			Destroy ();					// remove myself
			return;
		}
		if (StartTrans == -1)
		{
			StartTrans = TheDecal->Alpha;
		}

		int distanceToEnd = TimeToEndDecay - level.maptime;
		int fadeDistance = TimeToEndDecay - TimeToStartDecay;
		TheDecal->Alpha = StartTrans * distanceToEnd / fadeDistance;
	}
}